

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O3

void probability_sort(vector<unsigned_int,_std::allocator<unsigned_int>_> *vec)

{
  uint uVar1;
  uint *puVar2;
  undefined1 auVar3 [32];
  undefined8 uVar4;
  ulong uVar5;
  pointer ppVar6;
  pointer ppVar7;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __result;
  uint *puVar8;
  long lVar9;
  uint *x;
  ulong uVar10;
  uint *puVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  long unaff_RBP;
  uint uVar12;
  bool bVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [32];
  vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_> elems;
  vector<unsigned_int,_std::allocator<unsigned_int>_> remap;
  allocator_type local_51;
  vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_> local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  puVar8 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar11 = puVar8 + 1;
  if (puVar11 != puVar2 && puVar8 != puVar2) {
    uVar12 = *puVar8;
    do {
      uVar1 = *puVar11;
      bVar13 = uVar12 < uVar1;
      if (uVar12 <= uVar1) {
        uVar12 = uVar1;
      }
      if (bVar13) {
        puVar8 = puVar11;
      }
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar2);
  }
  uVar12 = *puVar8;
  std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>::
  vector(&local_50,(ulong)(uVar12 + 1),(allocator_type *)&local_38);
  ppVar7 = local_50.
           super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar6 = local_50.
           super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)local_50.
                super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_50.
                super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  if (local_50.
      super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_50.
      super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar16 = vpbroadcastq_avx512f(ZEXT816(8));
    uVar10 = lVar9 + (ulong)(lVar9 == 0) + 7 & 0xfffffffffffffff8;
    auVar17 = vpbroadcastq_avx512f();
    do {
      uVar4 = vpcmpuq_avx512f(auVar15,auVar17,2);
      auVar18 = vpsllq_avx512f(auVar15,4);
      uVar10 = uVar10 - 8;
      vpscatterqq_avx512f(ZEXT864(local_50.
                                  super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) + ZEXT864(8) + auVar18,
                          uVar4,auVar15);
      auVar15 = vpaddq_avx512f(auVar15,auVar16);
      vpscatterqq_avx512f(ZEXT864(local_50.
                                  super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) + auVar18,uVar4,
                          ZEXT1664((undefined1  [16])0x0));
    } while (uVar10 != 0);
  }
  puVar2 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar8 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1) {
    local_50.
    super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start[*puVar8].first =
         local_50.
         super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start[*puVar8].first + -1;
  }
  if (local_50.
      super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_50.
      super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<long,unsigned_long>*,std::vector<std::pair<long,unsigned_long>,std::allocator<std::pair<long,unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_50.
               super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_50.
               super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,(int)LZCOUNT(lVar9) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<long,unsigned_long>*,std::vector<std::pair<long,unsigned_long>,std::allocator<std::pair<long,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar6,ppVar7);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_38,(ulong)(uVar12 + 1),&local_51);
  if ((long)local_50.
            super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_50.
            super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    auVar3 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar16 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar19._8_4_ = 8;
    auVar19._0_8_ = 0x800000008;
    auVar19._12_4_ = 8;
    auVar19._16_4_ = 8;
    auVar19._20_4_ = 8;
    auVar19._24_4_ = 8;
    auVar19._28_4_ = 8;
    lVar9 = (long)local_50.
                  super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_50.
                  super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    uVar10 = lVar9 + (ulong)(lVar9 == 0) + 7 & 0xfffffffffffffff8;
    auVar17 = vpbroadcastq_avx512f();
    do {
      uVar5 = vpcmpuq_avx512f(auVar15,auVar17,2);
      vpsllq_avx512f(auVar15,4);
      auVar15 = vpaddq_avx512f(auVar15,auVar16);
      uVar10 = uVar10 - 8;
      auVar18 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)&(local_50.
                                             super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->second +
                                    unaff_RBP));
      auVar14._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar18._8_8_;
      auVar14._0_8_ = (ulong)((byte)uVar5 & 1) * auVar18._0_8_;
      auVar14._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar18._16_8_;
      auVar14._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar18._24_8_;
      vpscatterqd_avx512f(ZEXT832(local_38.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) +
                          auVar14 * (undefined1  [32])0x4,uVar5,auVar3);
      auVar3 = vpaddd_avx2(auVar3,auVar19);
    } while (uVar10 != 0);
  }
  puVar8 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar8 == puVar2) {
    if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_0011106e;
  }
  else {
    do {
      *puVar8 = local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[*puVar8] + 1;
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar2);
  }
  operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
LAB_0011106e:
  if (local_50.
      super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void probability_sort(std::vector<uint32_t>& vec)
{
    uint32_t max_elem = *std::max_element(vec.begin(), vec.end());
    std::vector<std::pair<int64_t, uint64_t>> elems(max_elem + 1);
    for (size_t i = 0; i < elems.size(); i++) {
        elems[i].second = i;
        elems[i].first = 0;
    }
    for (const auto& v : vec)
        elems[v].first--;
    std::sort(elems.begin(), elems.end());
    std::vector<uint32_t> remap(max_elem + 1);
    for (size_t i = 0; i < elems.size(); i++) {
        remap[elems[i].second] = i;
    }
    for (auto& x : vec)
        x = remap[x] + 1;
}